

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.h
# Opt level: O2

void __thiscall mau::PacketQueue::Pop(PacketQueue *this)

{
  QueueNode *pQVar1;
  
  if (this->Head != (QueueNode *)0x0) {
    pQVar1 = this->Head->Next;
    this->Head = pQVar1;
    if (pQVar1 == (QueueNode *)0x0) {
      this->Tail = (QueueNode *)0x0;
      return;
    }
    pQVar1->Prev = (QueueNode *)0x0;
  }
  return;
}

Assistant:

void Pop()
    {
        if (!Head) {
            return;
        }

        Head = Head->Next;
        if (!Head) {
            Tail = nullptr;
        }
        else {
            Head->Prev = nullptr;
        }
    }